

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameObject.cpp
# Opt level: O0

bool __thiscall GameObject::CheckCollision(GameObject *this,int x,int y,int radius)

{
  int local_2c;
  int local_28;
  int j;
  int i;
  int radius_local;
  int y_local;
  int x_local;
  GameObject *this_local;
  
  local_28 = -radius;
  do {
    if (radius < local_28) {
      return false;
    }
    for (local_2c = -radius; local_2c <= radius; local_2c = local_2c + 1) {
      if (((int)this->pos_x + local_28 == x) && ((int)this->pos_y + local_2c == y)) {
        return true;
      }
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

bool GameObject::CheckCollision(int x, int y, int radius)
{

  //is pos X or pos Y inside the point/radius?
for(int i=-radius;i<=radius;i++)
  { 
    for(int j=-radius;j<=radius;j++)
    { 

      if((static_cast<int>(pos_x)+i ==  x) && (static_cast<int>(pos_y)+j == y))
      {
        return true;
      }
    }

  } 
/*   if(static_cast<int>(pos_x) ==  x && static_cast<int>(pos_y) == y) ||
      {
        return true;
      }
 */     
  return false;

}